

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateDefaultFramebufferRenderCase::render
          (InvalidateDefaultFramebufferRenderCase *this,Surface *dst)

{
  deUint32 dVar1;
  bool bVar2;
  int width;
  int height;
  Context *pCVar3;
  size_type sVar4;
  deUint32 *local_260;
  Vector<float,_3> local_210;
  Vector<float,_3> local_204;
  Vector<float,_4> local_1f8;
  Vector<float,_3> local_1e8;
  Vector<float,_3> local_1dc;
  Vector<float,_4> local_1d0;
  Vector<float,_3> local_1c0;
  Vector<float,_3> local_1b4;
  Vector<float,_4> local_1a8;
  deUint32 local_198;
  deUint32 flatShaderID;
  undefined1 local_188 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  Surface *dst_local;
  InvalidateDefaultFramebufferRenderCase *this_local;
  
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,this->m_buffers);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_198 = (*pCVar3->_vptr_Context[0x75])
                        (pCVar3,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_198;
  tcu::Vector<float,_4>::Vector(&local_1a8,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar3,dVar1,&local_1a8);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_198;
  tcu::Vector<float,_3>::Vector(&local_1b4,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_1c0,1.0,1.0,1.0);
  sglr::drawQuad(pCVar3,dVar1,&local_1b4,&local_1c0);
  dVar1 = this->m_fboTarget;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
  if (bVar2) {
    local_260 = (deUint32 *)0x0;
  }
  else {
    local_260 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,0);
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,dVar1,(int)sVar4,local_260);
  if ((this->m_buffers & 0x4000) != 0) {
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
    pCVar3 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_198;
    tcu::Vector<float,_4>::Vector(&local_1d0,0.0,1.0,0.0,1.0);
    FboTestUtil::FlatColorShader::setColor
              ((FlatColorShader *)
               &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pCVar3,dVar1,&local_1d0);
    pCVar3 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_198;
    tcu::Vector<float,_3>::Vector(&local_1dc,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_1e8,1.0,1.0,0.0);
    sglr::drawQuad(pCVar3,dVar1,&local_1dc,&local_1e8);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  }
  if ((this->m_buffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  }
  if ((this->m_buffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_198;
  tcu::Vector<float,_4>::Vector(&local_1f8,0.0,0.0,1.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar3,dVar1,&local_1f8);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_198;
  tcu::Vector<float,_3>::Vector(&local_204,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_210,1.0,1.0,0.0);
  sglr::drawQuad(pCVar3,dVar1,&local_204,&local_210);
  width = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  height = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,width,height);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
  FboTestUtil::FlatColorShader::~FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		FlatColorShader		flatShader	(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments	= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(m_fboTarget, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0]);

		if ((m_buffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_buffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_buffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}